

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::VertexArrayTestGroup::init(VertexArrayTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"single_attribute","Single vertex atribute");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__SingleVertexArrayTestGroup_02141d78;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"multiple_attributes",
             "Multiple vertex atributes");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__MultiVertexArrayTestGroup_02141e90;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void VertexArrayTestGroup::init (void)
{
	addChild(new SingleVertexArrayTestGroup(m_context));
	addChild(new MultiVertexArrayTestGroup(m_context));
}